

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct_filter.cpp
# Opt level: O1

unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true> __thiscall
duckdb::StructFilter::Copy(StructFilter *this)

{
  idx_t child_idx_p;
  pointer pTVar1;
  StructFilter *this_00;
  pointer *__ptr;
  long in_RSI;
  _Head_base<0UL,_duckdb::TableFilter_*,_false> local_58;
  _Head_base<0UL,_duckdb::TableFilter_*,_false> local_50;
  string local_48;
  
  pTVar1 = unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>::
           operator->((unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>
                       *)(in_RSI + 0x38));
  (*pTVar1->_vptr_TableFilter[4])(&local_58,pTVar1);
  this_00 = (StructFilter *)operator_new(0x40);
  child_idx_p = *(idx_t *)(in_RSI + 0x10);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,*(long *)(in_RSI + 0x18),
             *(long *)(in_RSI + 0x20) + *(long *)(in_RSI + 0x18));
  local_50._M_head_impl = local_58._M_head_impl;
  local_58._M_head_impl = (TableFilter *)0x0;
  StructFilter(this_00,child_idx_p,&local_48,
               (unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true> *)
               &local_50);
  if (local_50._M_head_impl != (TableFilter *)0x0) {
    (*(local_50._M_head_impl)->_vptr_TableFilter[1])();
  }
  local_50._M_head_impl = (TableFilter *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  (this->super_TableFilter)._vptr_TableFilter = (_func_int **)this_00;
  if (local_58._M_head_impl != (TableFilter *)0x0) {
    (*(local_58._M_head_impl)->_vptr_TableFilter[1])();
  }
  return (unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_>)
         (unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_>)this;
}

Assistant:

unique_ptr<TableFilter> StructFilter::Copy() const {
	return make_uniq<StructFilter>(child_idx, child_name, child_filter->Copy());
}